

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSplitter.h
# Opt level: O2

char * __thiscall Assimp::LineSplitter::operator[](LineSplitter *this,size_t idx)

{
  char *pcVar1;
  range_error *this_00;
  ulong uVar2;
  size_t sVar3;
  char *s;
  
  s = (this->mCur)._M_dataplus._M_p;
  SkipSpaces<char>(&s);
  sVar3 = 0;
  do {
    pcVar1 = s;
    if (sVar3 == idx) {
      return s;
    }
    while( true ) {
      do {
        s = pcVar1;
        uVar2 = (ulong)(byte)*s;
        pcVar1 = s + 1;
      } while (0x20 < uVar2);
      if ((0x100000200U >> (uVar2 & 0x3f) & 1) != 0) break;
      if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
        this_00 = (range_error *)__cxa_allocate_exception(0x10);
        std::range_error::range_error(this_00,"Token index out of range, EOL reached");
        __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
      }
    }
    SkipSpaces<char>(&s);
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

AI_FORCE_INLINE
const char *LineSplitter::operator[] (size_t idx) const {
    const char* s = operator->()->c_str();

    SkipSpaces(&s);
    for (size_t i = 0; i < idx; ++i) {

        for (; !IsSpace(*s); ++s) {
            if (IsLineEnd(*s)) {
                throw std::range_error("Token index out of range, EOL reached");
            }
        }
        SkipSpaces(&s);
    }
    return s;
}